

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O3

int IDAApolynomialStorePnt(IDAMem IDA_mem,IDAdtpntMem d)

{
  IDAadjMemRec *pIVar1;
  undefined8 *puVar2;
  sunrealtype *psVar3;
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  long lVar10;
  
  pIVar1 = IDA_mem->ida_adj_mem;
  puVar2 = (undefined8 *)d->content;
  N_VScale(0x3ff0000000000000,IDA_mem->ida_phi[0],*puVar2);
  if ((N_Vector)puVar2[2] != (N_Vector)0x0) {
    IDAAGettnSolutionYp(IDA_mem,(N_Vector)puVar2[2]);
  }
  auVar4 = _DAT_00134060;
  if (pIVar1->ia_storeSensi != 0) {
    iVar5 = IDA_mem->ida_Ns;
    lVar7 = (long)iVar5;
    psVar3 = IDA_mem->ida_cvals;
    if (0 < lVar7) {
      lVar6 = lVar7 + -1;
      auVar8._8_4_ = (int)lVar6;
      auVar8._0_8_ = lVar6;
      auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
      lVar6 = 0;
      auVar8 = auVar8 ^ _DAT_00134060;
      auVar9 = _DAT_00134050;
      do {
        auVar11 = auVar9 ^ auVar4;
        if ((bool)(~(auVar11._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar11._0_4_ ||
                    auVar8._4_4_ < auVar11._4_4_) & 1)) {
          *(undefined8 *)((long)psVar3 + lVar6) = 0x3ff0000000000000;
        }
        if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
            auVar11._12_4_ <= auVar8._12_4_) {
          *(undefined8 *)((long)psVar3 + lVar6 + 8) = 0x3ff0000000000000;
        }
        lVar10 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar10 + 2;
        lVar6 = lVar6 + 0x10;
      } while ((ulong)(iVar5 + 1U >> 1) << 4 != lVar6);
    }
    iVar5 = N_VScaleVectorArray(lVar7,psVar3,IDA_mem->ida_phiS[0],puVar2[1]);
    if (iVar5 != 0) {
      return -0x1c;
    }
    if ((N_Vector *)puVar2[3] != (N_Vector *)0x0) {
      IDAAGettnSolutionYpS(IDA_mem,(N_Vector *)puVar2[3]);
    }
  }
  *(int *)(puVar2 + 4) = IDA_mem->ida_kused;
  return 0;
}

Assistant:

static int IDAApolynomialStorePnt(IDAMem IDA_mem, IDAdtpntMem d)
{
  IDAadjMem IDAADJ_mem;
  IDApolynomialDataMem content;
  int is, retval;

  IDAADJ_mem = IDA_mem->ida_adj_mem;
  content    = (IDApolynomialDataMem)d->content;

  N_VScale(ONE, IDA_mem->ida_phi[0], content->y);

  /* copy also the derivative for the first data point (in this case
     content->yp is non-null). */
  if (content->yd) { IDAAGettnSolutionYp(IDA_mem, content->yd); }

  if (IDAADJ_mem->ia_storeSensi)
  {
    for (is = 0; is < IDA_mem->ida_Ns; is++) { IDA_mem->ida_cvals[is] = ONE; }

    retval = N_VScaleVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_cvals,
                                 IDA_mem->ida_phiS[0], content->yS);
    if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

    /* store the derivative if it is the first data point. */
    if (content->ySd) { IDAAGettnSolutionYpS(IDA_mem, content->ySd); }
  }

  content->order = IDA_mem->ida_kused;

  return (0);
}